

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O3

int pt_iscache_expand(pt_image_section_cache *iscache)

{
  pt_iscache_entry *ppVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = -9;
  if ((ushort)*(int *)&iscache->capacity < 0xfff8) {
    uVar3 = *(int *)&iscache->capacity + 8;
    ppVar1 = (pt_iscache_entry *)realloc(iscache->entries,(ulong)((uVar3 & 0xffff) << 4));
    if (ppVar1 != (pt_iscache_entry *)0x0) {
      iscache->capacity = (uint16_t)uVar3;
      iscache->entries = ppVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int pt_iscache_expand(struct pt_image_section_cache *iscache)
{
	struct pt_iscache_entry *entries;
	uint16_t capacity, target;

	if (!iscache)
		return -pte_internal;

	capacity = iscache->capacity;
	target = capacity + 8;

	/* Check for overflows. */
	if (target < capacity)
		return -pte_nomem;

	entries = realloc(iscache->entries, target * sizeof(*entries));
	if (!entries)
		return -pte_nomem;

	iscache->capacity = target;
	iscache->entries = entries;
	return 0;
}